

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstractitemdelegate.cpp
# Opt level: O0

void QAbstractItemDelegate::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  QWidget *_t1;
  QMetaType QVar2;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  QAbstractItemDelegate *_t;
  QWidget *in_stack_ffffffffffffff48;
  QAbstractItemDelegatePrivate *in_stack_ffffffffffffff50;
  EndEditHint _t2;
  QMetaType local_48;
  QMetaTypeInterface *local_40;
  QMetaType local_38;
  QMetaTypeInterface *local_30;
  QMetaType local_28;
  QMetaTypeInterface *local_20;
  QMetaType local_18;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    _t1 = (QWidget *)(ulong)in_EDX;
    _t2 = (EndEditHint)((ulong)in_stack_ffffffffffffff50 >> 0x20);
    switch(_t1) {
    case (QWidget *)0x0:
      commitData((QAbstractItemDelegate *)0x7fd9f2,in_stack_ffffffffffffff48);
      break;
    case (QWidget *)0x1:
      closeEditor((QAbstractItemDelegate *)in_stack_ffffffffffffff48,_t1,_t2);
      break;
    case (QWidget *)0x2:
      closeEditor((QAbstractItemDelegate *)in_stack_ffffffffffffff48,_t1,_t2);
      break;
    case (QWidget *)0x3:
      sizeHintChanged((QAbstractItemDelegate *)in_stack_ffffffffffffff50,
                      (QModelIndex *)in_stack_ffffffffffffff48);
      break;
    case (QWidget *)0x4:
      d_func((QAbstractItemDelegate *)0x7fda50);
      QAbstractItemDelegatePrivate::_q_commitDataAndCloseEditor
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    }
  }
  if (in_ESI == 7) {
    switch(in_EDX) {
    case 0:
      if (**(int **)(in_RCX + 8) == 0) {
        local_20 = (QMetaTypeInterface *)QMetaType::fromType<QWidget*>();
        **(undefined8 **)in_RCX = local_20;
      }
      else {
        memset(&local_18,0,8);
        QMetaType::QMetaType(&local_18);
        **(undefined8 **)in_RCX = local_18.d_ptr;
      }
      break;
    case 1:
      if (**(int **)(in_RCX + 8) == 0) {
        local_30 = (QMetaTypeInterface *)QMetaType::fromType<QWidget*>();
        **(undefined8 **)in_RCX = local_30;
      }
      else {
        memset(&local_28,0,8);
        QMetaType::QMetaType(&local_28);
        **(undefined8 **)in_RCX = local_28.d_ptr;
      }
      break;
    case 2:
      if (**(int **)(in_RCX + 8) == 0) {
        local_40 = (QMetaTypeInterface *)QMetaType::fromType<QWidget*>();
        **(undefined8 **)in_RCX = local_40;
      }
      else {
        memset(&local_38,0,8);
        QMetaType::QMetaType(&local_38);
        **(undefined8 **)in_RCX = local_38.d_ptr;
      }
      break;
    default:
      memset(&local_10,0,8);
      QMetaType::QMetaType(&local_10);
      **(undefined8 **)in_RCX = local_10.d_ptr;
      break;
    case 4:
      if (**(int **)(in_RCX + 8) == 0) {
        QVar2 = QMetaType::fromType<QWidget*>();
        **(undefined8 **)in_RCX = QVar2.d_ptr;
      }
      else {
        memset(&local_48,0,8);
        QMetaType::QMetaType(&local_48);
        **(undefined8 **)in_RCX = local_48.d_ptr;
      }
    }
  }
  if (((in_ESI == 5) &&
      (bVar1 = QtMocHelpers::indexOfMethod<void(QAbstractItemDelegate::*)(QWidget*)>
                         (in_RCX,(void **)commitData,0,0), !bVar1)) &&
     (bVar1 = QtMocHelpers::
              indexOfMethod<void(QAbstractItemDelegate::*)(QWidget*,QAbstractItemDelegate::EndEditHint)>
                        (in_RCX,(void **)closeEditor,0,1), !bVar1)) {
    QtMocHelpers::indexOfMethod<void(QAbstractItemDelegate::*)(QModelIndex_const&)>
              (in_RCX,(void **)sizeHintChanged,0,3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemDelegate::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QAbstractItemDelegate *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->commitData((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1]))); break;
        case 1: _t->closeEditor((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractItemDelegate::EndEditHint>>(_a[2]))); break;
        case 2: _t->closeEditor((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1]))); break;
        case 3: _t->sizeHintChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 4: _t->d_func()->_q_commitDataAndCloseEditor((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemDelegate::*)(QWidget * )>(_a, &QAbstractItemDelegate::commitData, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemDelegate::*)(QWidget * , QAbstractItemDelegate::EndEditHint )>(_a, &QAbstractItemDelegate::closeEditor, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemDelegate::*)(const QModelIndex & )>(_a, &QAbstractItemDelegate::sizeHintChanged, 3))
            return;
    }
}